

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

void qlist_write(t_qlist *x,t_symbol *filename,t_symbol *format)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint crflag;
  char buf [1000];
  char acStack_408 [1000];
  
  canvas_makefilename((x->x_textbuf).b_canvas,filename->s_name,acStack_408,1000);
  pbVar2 = (byte *)format->s_name;
  bVar1 = *pbVar2;
  crflag = (uint)bVar1;
  if (bVar1 != 0) {
    if (((bVar1 == 99) && (pbVar2[1] == 0x72)) && (pbVar2[2] == 0)) {
      crflag = 1;
    }
    else {
      crflag = 0;
      pd_error(x,"qlist_read: unknown flag: %s");
    }
  }
  iVar3 = binbuf_write((x->x_textbuf).b_binbuf,acStack_408,"",crflag);
  if (iVar3 != 0) {
    pd_error(x,"%s: write failed",filename->s_name);
  }
  return;
}

Assistant:

static void qlist_write(t_qlist *x, t_symbol *filename, t_symbol *format)
{
    int cr = 0;
    char buf[MAXPDSTRING];
    canvas_makefilename(x->x_canvas, filename->s_name,
        buf, MAXPDSTRING);
    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(x, "qlist_read: unknown flag: %s", format->s_name);
    if (binbuf_write(x->x_binbuf, buf, "", cr))
            pd_error(x, "%s: write failed", filename->s_name);
}